

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.h
# Opt level: O3

void __thiscall OutputContext::Print(OutputContext *this,char *format,__va_list_tag *args)

{
  byte *pbVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  char cVar6;
  int iVar7;
  undefined8 *puVar8;
  uint *puVar9;
  byte *pbVar10;
  size_t sVar11;
  uint uVar12;
  ulong uVar13;
  byte *pbVar14;
  ulong uVar15;
  uint uVar16;
  char *pcVar17;
  long lVar18;
  char reverse [16];
  char forward [16];
  byte local_58;
  byte local_57 [15];
  byte local_48 [24];
  
  while( true ) {
    for (lVar18 = 0; (cVar2 = format[lVar18], cVar2 != '\0' && (cVar2 != '%')); lVar18 = lVar18 + 1)
    {
    }
    if (lVar18 != 0) {
      Print(this,format,(uint)lVar18);
      cVar2 = format[lVar18];
    }
    if (cVar2 != '%') break;
    cVar2 = format[lVar18 + 1];
    if (cVar2 == '%') {
      format = format + lVar18 + 2;
      uVar16 = this->outputBufPos;
      this->outputBufPos = uVar16 + 1;
      this->outputBuf[uVar16] = '%';
      if (this->outputBufPos == this->outputBufSize) {
        (*this->writeStream)(this->stream,this->outputBuf,this->outputBufPos);
        this->outputBufPos = 0;
      }
    }
    else if (cVar2 == '.') {
      if ((format[lVar18 + 2] != '*') || (format[lVar18 + 3] != 's')) goto LAB_001120a0;
      uVar16 = args->gp_offset;
      uVar13 = (ulong)uVar16;
      if (uVar13 < 0x29) {
        args->gp_offset = (uint)(uVar13 + 8);
        uVar12 = *(uint *)((long)args->reg_save_area + uVar13);
        if (0x20 < uVar16) goto LAB_00112312;
        puVar8 = (undefined8 *)(uVar13 + 8 + (long)args->reg_save_area);
        args->gp_offset = uVar16 + 0x10;
      }
      else {
        puVar9 = (uint *)args->overflow_arg_area;
        args->overflow_arg_area = puVar9 + 2;
        uVar12 = *puVar9;
LAB_00112312:
        puVar8 = (undefined8 *)args->overflow_arg_area;
        args->overflow_arg_area = puVar8 + 1;
      }
      format = format + lVar18 + 4;
      Print(this,(char *)*puVar8,uVar12);
    }
    else if (cVar2 == 's') {
      uVar16 = args->gp_offset;
      if ((ulong)uVar16 < 0x29) {
        puVar8 = (undefined8 *)((ulong)uVar16 + (long)args->reg_save_area);
        args->gp_offset = uVar16 + 8;
      }
      else {
        puVar8 = (undefined8 *)args->overflow_arg_area;
        args->overflow_arg_area = puVar8 + 1;
      }
      format = format + lVar18 + 2;
      pcVar17 = (char *)*puVar8;
      sVar11 = strlen(pcVar17);
      Print(this,pcVar17,(uint)sVar11);
    }
    else {
LAB_001120a0:
      lVar5 = lVar18 + 2;
      if (cVar2 != '0') {
        lVar5 = lVar18 + 1;
      }
      uVar16 = (int)format[lVar5] - 0x30;
      pcVar17 = format + lVar5 + (uVar16 < 10);
      if ((*pcVar17 != 'x') && (*pcVar17 != 'd')) goto LAB_00112341;
      uVar12 = args->gp_offset;
      if ((ulong)uVar12 < 0x29) {
        puVar9 = (uint *)((ulong)uVar12 + (long)args->reg_save_area);
        args->gp_offset = uVar12 + 8;
      }
      else {
        puVar9 = (uint *)args->overflow_arg_area;
        args->overflow_arg_area = puVar9 + 2;
      }
      uVar12 = *puVar9;
      cVar6 = *pcVar17;
      if ((cVar6 == 'd') && ((int)uVar12 < 0)) {
        uVar3 = this->outputBufPos;
        this->outputBufPos = uVar3 + 1;
        this->outputBuf[uVar3] = '-';
        if (this->outputBufPos == this->outputBufSize) {
          (*this->writeStream)(this->stream,this->outputBuf,this->outputBufPos);
          this->outputBufPos = 0;
        }
        cVar6 = *pcVar17;
      }
      if (cVar6 == 'd') {
        uVar3 = -uVar12;
        if (0 < (int)uVar12) {
          uVar3 = uVar12;
        }
        uVar13 = (ulong)uVar3;
        local_58 = (char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30;
        pbVar10 = local_57;
        if (9 < uVar3) {
          do {
            uVar12 = (uint)uVar13;
            uVar15 = uVar13 / 10;
            uVar13 = uVar13 / 10;
            *pbVar10 = (char)uVar13 + (char)(uVar15 * 0x1999999a >> 0x20) * -10 | 0x30;
            pbVar10 = pbVar10 + 1;
          } while (99 < uVar12);
        }
      }
      else {
        local_58 = "0123456789abcdef"[uVar12 & 0xf];
        pbVar10 = local_57;
        if (0xf < uVar12) {
          do {
            *pbVar10 = "0123456789abcdef"[uVar12 >> 4 & 0xf];
            pbVar10 = pbVar10 + 1;
            bVar4 = 0xff < uVar12;
            uVar12 = uVar12 >> 4;
          } while (bVar4);
        }
      }
      if ((uVar16 < 10) && (uVar12 = (int)pbVar10 - (int)&local_58, uVar12 < uVar16)) {
        do {
          *pbVar10 = (cVar2 == '0') << 4 | 0x20;
          pbVar10 = pbVar10 + 1;
          uVar12 = uVar12 + 1;
        } while (uVar12 < uVar16);
      }
      format = pcVar17 + 1;
      pbVar14 = local_48;
      do {
        pbVar1 = pbVar10 + -1;
        pbVar10 = pbVar10 + -1;
        *pbVar14 = *pbVar1;
        pbVar14 = pbVar14 + 1;
      } while (pbVar10 != &local_58);
      *pbVar14 = 0;
      sVar11 = strlen((char *)local_48);
      Print(this,(char *)local_48,(uint)sVar11);
    }
  }
  if (cVar2 != '\0') {
LAB_00112341:
    iVar7 = vsnprintf(this->tempBuf,(ulong)(this->tempBufSize - 1),format + lVar18,args);
    if ((iVar7 < 0) || ((int)this->tempBufSize <= iVar7)) {
      (*this->writeStream)(this->stream,this->outputBuf,this->outputBufPos);
      this->outputBufPos = 0;
      (*this->writeStream)(this->stream,this->tempBuf,this->tempBufSize - 1);
      __assert_fail("!\"temporary buffer is too small\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Output.h"
                    ,0xe4,"void OutputContext::Print(const char *, __va_list_tag *)");
    }
    pcVar17 = this->tempBuf;
    sVar11 = strlen(pcVar17);
    Print(this,pcVar17,(uint)sVar11);
  }
  return;
}

Assistant:

void Print(const char *format, va_list args)
	{
		const char *pos = format;

		for(;;)
		{
			const char *start = pos;

			while(*pos && *pos != '%')
				pos++;

			if(pos != start)
				Print(start, unsigned(pos - start));

			if(pos[0] == '%' && pos[1] == 's')
			{
				pos += 2;

				char *str = va_arg(args, char*);

				Print(str);
			}
			else if(pos[0] == '%' && pos[1] == '.' && pos[2] == '*' && pos[3] == 's')
			{
				pos += 4;

				unsigned length = va_arg(args, unsigned);
				char *str = va_arg(args, char*);

				Print(str, length);
			}
			else if(pos[0] == '%' && pos[1] == '%')
			{
				pos += 2;

				Print('%');
			}
			else if(pos[0] == '%')
			{
				const char *tmpPos = pos + 1;

				bool leadingZeroes = false;

				if(*tmpPos == '0')
				{
					leadingZeroes = true;

					tmpPos++;
				}

				unsigned width = 0;

				if(unsigned(*tmpPos - '0') < 10)
				{
					width = unsigned(*tmpPos - '0');

					tmpPos++;
				}

				if(*tmpPos == 'd' || *tmpPos == 'x')
				{
					pos = tmpPos + 1;

					int value = va_arg(args, int);

					if(*tmpPos == 'd' && value < 0)
						Print('-');

					unsigned uvalue;

					if(*tmpPos == 'd' && value < 0)
						uvalue = -value;
					else
						uvalue = value;

					char reverse[16];

					char *curr = reverse;

					if(*tmpPos == 'd')
					{
						*curr++ = (char)((uvalue % 10) + '0');

						while(uvalue /= 10)
							*curr++ = (char)((uvalue % 10) + '0');
					}
					else
					{
						const char *symbols = "0123456789abcdef";

						*curr++ = symbols[uvalue % 16];

						while(uvalue /= 16)
							*curr++ = symbols[uvalue % 16];
					}

					while(unsigned(curr - reverse) < width)
						*curr++ = leadingZeroes ? '0' : ' ';

					char forward[16];

					char *result = forward;

					do
					{
						--curr;
						*result++ = *curr;
					}
					while(curr != reverse);

					*result = 0;

					Print(forward);
				}
				else
				{
					break;
				}
			}
			else if(pos[0] == 0)
			{
				return;
			}
			else
			{
				break;
			}
		}

		int length = vsnprintf(tempBuf, tempBufSize - 1, pos, args);

		if(length < 0 || length > int(tempBufSize) - 1)
		{
			writeStream(stream, outputBuf, outputBufPos);
			outputBufPos = 0;

			writeStream(stream, tempBuf, tempBufSize - 1);

			assert(!"temporary buffer is too small");
		}
		else
		{
			Print(tempBuf);
		}
	}